

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_1x1_pack16to8.h
# Opt level: O1

void ncnn::conv1x1s2_sgemm_pack16to8_avx512
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  int iVar1;
  uint _c;
  int _w;
  int _h;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int *piVar9;
  ulong uVar10;
  undefined8 *puVar11;
  undefined8 *puVar12;
  int iVar13;
  int iVar14;
  Mat local_98;
  Mat *local_48;
  Mat *local_40;
  Option *local_38;
  
  iVar1 = bottom_blob->w;
  _c = bottom_blob->c;
  _w = top_blob->w;
  _h = top_blob->h;
  local_98.cstep = 0;
  local_98.data = (void *)0x0;
  local_98.refcount._0_4_ = 0;
  local_98.refcount._4_4_ = 0;
  local_98.elemsize._0_4_ = 0;
  local_98.elemsize._4_4_ = 0;
  local_98.elempack = 0;
  local_98.allocator = (Allocator *)0x0;
  local_98.dims = 0;
  local_98.w = 0;
  local_98.h = 0;
  local_98.d = 0;
  local_98.c = 0;
  local_48 = kernel;
  local_40 = _bias;
  local_38 = opt;
  Mat::create(&local_98,_w,_h,_c,bottom_blob->elemsize,bottom_blob->elempack,
              opt->workspace_allocator);
  if (0 < (int)_c) {
    uVar10 = 0;
    do {
      if (0 < _h) {
        puVar11 = (undefined8 *)
                  (local_98.cstep * uVar10 *
                   CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize) +
                  (long)local_98.data);
        puVar12 = (undefined8 *)
                  (bottom_blob->cstep * uVar10 * bottom_blob->elemsize + (long)bottom_blob->data);
        iVar13 = 0;
        do {
          iVar14 = _w;
          if (0 < _w) {
            do {
              uVar2 = puVar12[1];
              uVar3 = puVar12[2];
              uVar4 = puVar12[3];
              uVar5 = puVar12[4];
              uVar6 = puVar12[5];
              uVar7 = puVar12[6];
              uVar8 = puVar12[7];
              *puVar11 = *puVar12;
              puVar11[1] = uVar2;
              puVar11[2] = uVar3;
              puVar11[3] = uVar4;
              puVar11[4] = uVar5;
              puVar11[5] = uVar6;
              puVar11[6] = uVar7;
              puVar11[7] = uVar8;
              puVar12 = puVar12 + 0x10;
              puVar11 = puVar11 + 8;
              iVar14 = iVar14 + -1;
            } while (iVar14 != 0);
          }
          puVar12 = (undefined8 *)((long)puVar12 + (long)((iVar1 - _w) * 0x20) * 4);
          iVar13 = iVar13 + 1;
        } while (iVar13 != _h);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != _c);
  }
  conv1x1s1_sgemm_pack16to8_avx512(&local_98,top_blob,local_48,local_40,local_38);
  piVar9 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
  if (piVar9 != (int *)0x0) {
    LOCK();
    *piVar9 = *piVar9 + -1;
    UNLOCK();
    if (*piVar9 == 0) {
      if (local_98.allocator == (Allocator *)0x0) {
        if (local_98.data != (void *)0x0) {
          free(local_98.data);
        }
      }
      else {
        (*(local_98.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv1x1s2_sgemm_pack16to8_avx512(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int tailstep = (w - 2 * outw + w) * 16;

    Mat bottom_blob_shrinked;
    bottom_blob_shrinked.create(outw, outh, channels, elemsize, elempack, opt.workspace_allocator);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < channels; p++)
    {
        const float* r0 = bottom_blob.channel(p);
        float* outptr = bottom_blob_shrinked.channel(p);

        for (int i = 0; i < outh; i++)
        {
            int j = 0;
            for (; j < outw; j++)
            {
                __m512 _v = _mm512_load_ps(r0);
                _mm512_store_ps(outptr, _v);

                r0 += 32;
                outptr += 16;
            }

            r0 += tailstep;
        }
    }

    conv1x1s1_sgemm_pack16to8_avx512(bottom_blob_shrinked, top_blob, kernel, _bias, opt);
}